

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
::find<std::vector<int,std::allocator<int>>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
           *this,key_arg<std::vector<int>_> *key)

{
  pointer piVar1;
  uint64_t uVar2;
  ulong uVar3;
  iterator iVar4;
  
  AssertHashEqConsistent<std::vector<int,std::allocator<int>>>(this,key);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)this);
  piVar1 = (key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar2 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,piVar1,
                     (long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar1);
  uVar3 = ((long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2 ^ uVar2) * -0x234dd359734ecb13;
  iVar4 = find_non_soo<std::vector<int,std::allocator<int>>>
                    (this,key,uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                              (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                              (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                              (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
  return iVar4;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }